

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_257,_false,_embree::avx512::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  BVH *bvh;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  char cVar26;
  byte bVar27;
  bool bVar28;
  byte bVar29;
  undefined4 uVar30;
  ulong uVar31;
  long lVar32;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar33;
  NodeRef root;
  size_t sVar34;
  size_t sVar35;
  byte bVar36;
  uint uVar37;
  NodeRef *pNVar38;
  byte bVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vint4 ai_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  vint4 bi;
  undefined1 auVar64 [16];
  vint4 bi_1;
  undefined1 auVar65 [16];
  vint4 bi_3;
  undefined1 auVar66 [16];
  undefined1 in_ZMM4 [64];
  vint4 ai;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 bi_2;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar75;
  float fVar76;
  vint4 ai_1;
  float fVar77;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 bi_10;
  undefined1 auVar78 [16];
  vfloat4 a0;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  int iVar42;
  int iVar43;
  int iVar59;
  int iVar60;
  int iVar61;
  
  bvh = (BVH *)This->ptr;
  sVar35 = (bvh->root).ptr;
  if (sVar35 != 8) {
    auVar51 = *(undefined1 (*) [16])(ray + 0x80);
    auVar46 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar20 = ZEXT812(0) << 0x20;
    auVar47 = ZEXT816(0) << 0x40;
    uVar13 = vcmpps_avx512vl(auVar51,auVar47,5);
    uVar40 = vpcmpeqd_avx512vl(auVar46,(undefined1  [16])valid_i->field_0);
    uVar40 = ((byte)uVar13 & 0xf) & uVar40;
    bVar39 = (byte)uVar40;
    if (bVar39 != 0) {
      tray.dir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x40))->v;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x50))->v;
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      fVar6 = tray.dir.field_0._32_4_;
      auVar44._0_4_ = fVar6 * fVar6;
      fVar7 = tray.dir.field_0._36_4_;
      auVar44._4_4_ = fVar7 * fVar7;
      fVar8 = tray.dir.field_0._40_4_;
      auVar44._8_4_ = fVar8 * fVar8;
      fVar9 = tray.dir.field_0._44_4_;
      auVar44._12_4_ = fVar9 * fVar9;
      auVar45 = vfmadd231ps_fma(auVar44,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar45 = vfmadd231ps_fma(auVar45,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar44 = vrsqrt14ps_avx512vl(auVar45);
      auVar50._8_4_ = 0xbf000000;
      auVar50._0_8_ = 0xbf000000bf000000;
      auVar50._12_4_ = 0xbf000000;
      auVar45 = vmulps_avx512vl(auVar45,auVar50);
      fVar71 = auVar44._0_4_;
      fVar75 = auVar44._4_4_;
      fVar76 = auVar44._8_4_;
      fVar77 = auVar44._12_4_;
      auVar52._0_4_ = fVar71 * fVar71 * fVar71 * auVar45._0_4_;
      auVar52._4_4_ = fVar75 * fVar75 * fVar75 * auVar45._4_4_;
      auVar52._8_4_ = fVar76 * fVar76 * fVar76 * auVar45._8_4_;
      auVar52._12_4_ = fVar77 * fVar77 * fVar77 * auVar45._12_4_;
      auVar45._8_4_ = 0x3fc00000;
      auVar45._0_8_ = 0x3fc000003fc00000;
      auVar45._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar52,auVar44,auVar45);
      auVar53._8_4_ = 0x80000000;
      auVar53._0_8_ = 0x8000000080000000;
      auVar53._12_4_ = 0x80000000;
      uVar31 = uVar40;
      do {
        lVar32 = 0;
        for (uVar41 = uVar31; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
          lVar32 = lVar32 + 1;
        }
        uVar41 = (ulong)(uint)((int)lVar32 * 4);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar41 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar41 + 0x50)),0x1c);
        fVar71 = *(float *)((long)pre.ray_space + (uVar41 - 0x10));
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + uVar41 + 0x60)),0x28);
        auVar58._0_4_ = auVar45._0_4_ * fVar71;
        auVar58._4_4_ = auVar45._4_4_ * fVar71;
        auVar58._8_4_ = auVar45._8_4_ * fVar71;
        auVar58._12_4_ = auVar45._12_4_ * fVar71;
        auVar50 = vshufpd_avx(auVar58,auVar58,1);
        auVar45 = vmovshdup_avx(auVar58);
        auVar86._0_4_ = auVar45._0_4_ ^ 0x80000000;
        auVar52 = vunpckhps_avx(auVar58,auVar47);
        auVar83._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
        auVar83._8_8_ = auVar50._8_8_ ^ auVar53._8_8_;
        auVar44 = vinsertps_avx(auVar83,auVar58,0x2a);
        auVar45 = vdpps_avx(auVar44,auVar44,0x7f);
        auVar86._4_12_ = auVar20;
        auVar52 = vshufps_avx(auVar52,auVar86,0x41);
        auVar50 = vdpps_avx(auVar52,auVar52,0x7f);
        uVar13 = vcmpps_avx512vl(auVar45,auVar50,1);
        auVar45 = vpmovm2d_avx512vl(uVar13);
        auVar89._0_4_ = auVar45._0_4_;
        auVar89._4_4_ = auVar89._0_4_;
        auVar89._8_4_ = auVar89._0_4_;
        auVar89._12_4_ = auVar89._0_4_;
        uVar41 = vpmovd2m_avx512vl(auVar89);
        auVar54._4_4_ = (uint)((byte)(uVar41 >> 1) & 1) * auVar46._4_4_;
        auVar54._0_4_ = (uint)((byte)uVar41 & 1) * auVar46._0_4_;
        auVar54._8_4_ = (uint)((byte)(uVar41 >> 2) & 1) * auVar46._8_4_;
        auVar54._12_4_ = (uint)((byte)(uVar41 >> 3) & 1) * auVar46._12_4_;
        auVar45 = vblendvps_avx(auVar44,auVar52,auVar54);
        auVar50 = vdpps_avx(auVar45,auVar45,0x7f);
        auVar90._4_12_ = auVar20;
        auVar90._0_4_ = auVar50._0_4_;
        auVar44 = vrsqrt14ss_avx512f(auVar47,auVar90);
        fVar75 = auVar44._0_4_;
        fVar75 = fVar75 * 1.5 - auVar50._0_4_ * 0.5 * fVar75 * fVar75 * fVar75;
        auVar84._0_4_ = auVar45._0_4_ * fVar75;
        auVar84._4_4_ = auVar45._4_4_ * fVar75;
        auVar84._8_4_ = auVar45._8_4_ * fVar75;
        auVar84._12_4_ = auVar45._12_4_ * fVar75;
        auVar45 = vshufps_avx(auVar84,auVar84,0xc9);
        auVar50 = vshufps_avx(auVar58,auVar58,0xc9);
        auVar91._0_4_ = auVar84._0_4_ * auVar50._0_4_;
        auVar91._4_4_ = auVar84._4_4_ * auVar50._4_4_;
        auVar91._8_4_ = auVar84._8_4_ * auVar50._8_4_;
        auVar91._12_4_ = auVar84._12_4_ * auVar50._12_4_;
        auVar45 = vfmsub231ps_fma(auVar91,auVar58,auVar45);
        auVar50 = vshufps_avx(auVar45,auVar45,0xc9);
        auVar45 = vdpps_avx(auVar50,auVar50,0x7f);
        uVar31 = uVar31 - 1 & uVar31;
        auVar93._4_12_ = auVar20;
        auVar93._0_4_ = auVar45._0_4_;
        auVar44 = vrsqrt14ss_avx512f(auVar47,auVar93);
        fVar75 = auVar44._0_4_;
        fVar75 = fVar75 * 1.5 - auVar45._0_4_ * 0.5 * fVar75 * fVar75 * fVar75;
        auVar87._0_4_ = fVar75 * auVar50._0_4_;
        auVar87._4_4_ = fVar75 * auVar50._4_4_;
        auVar87._8_4_ = fVar75 * auVar50._8_4_;
        auVar87._12_4_ = fVar75 * auVar50._12_4_;
        auVar79._0_4_ = fVar71 * auVar58._0_4_;
        auVar79._4_4_ = fVar71 * auVar58._4_4_;
        auVar79._8_4_ = fVar71 * auVar58._8_4_;
        auVar79._12_4_ = fVar71 * auVar58._12_4_;
        auVar44 = vunpcklps_avx(auVar84,auVar79);
        auVar45 = vunpckhps_avx(auVar84,auVar79);
        auVar52 = vunpcklps_avx(auVar87,auVar47);
        auVar50 = vunpckhps_avx(auVar87,auVar47);
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar45,auVar50);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar44,auVar52);
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar44,auVar52);
        pre.ray_space[lVar32].vx.field_0 = aVar12;
        pre.ray_space[lVar32].vy.field_0 = aVar10;
        pre.ray_space[lVar32].vz.field_0 = aVar11;
      } while (uVar31 != 0);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar94 = ZEXT1664(auVar46);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar95 = ZEXT1664(auVar47);
      auVar45 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar46);
      uVar31 = vcmpps_avx512vl(auVar45,auVar47,1);
      bVar28 = (bool)((byte)uVar31 & 1);
      iVar42 = auVar47._0_4_;
      auVar48._0_4_ = (uint)bVar28 * iVar42 | (uint)!bVar28 * tray.dir.field_0._0_4_;
      bVar28 = (bool)((byte)(uVar31 >> 1) & 1);
      iVar43 = auVar47._4_4_;
      auVar48._4_4_ = (uint)bVar28 * iVar43 | (uint)!bVar28 * tray.dir.field_0._4_4_;
      bVar28 = (bool)((byte)(uVar31 >> 2) & 1);
      iVar59 = auVar47._8_4_;
      iVar60 = auVar47._12_4_;
      auVar48._8_4_ = (uint)bVar28 * iVar59 | (uint)!bVar28 * tray.dir.field_0._8_4_;
      bVar28 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar48._12_4_ = (uint)bVar28 * iVar60 | (uint)!bVar28 * tray.dir.field_0._12_4_;
      auVar45 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar46);
      uVar31 = vcmpps_avx512vl(auVar45,auVar47,1);
      bVar28 = (bool)((byte)uVar31 & 1);
      auVar49._0_4_ = (uint)bVar28 * iVar42 | (uint)!bVar28 * tray.dir.field_0._16_4_;
      bVar28 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar49._4_4_ = (uint)bVar28 * iVar43 | (uint)!bVar28 * tray.dir.field_0._20_4_;
      bVar28 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar49._8_4_ = (uint)bVar28 * iVar59 | (uint)!bVar28 * tray.dir.field_0._24_4_;
      bVar28 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar49._12_4_ = (uint)bVar28 * iVar60 | (uint)!bVar28 * tray.dir.field_0._28_4_;
      auVar46 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar46);
      uVar31 = vcmpps_avx512vl(auVar46,auVar47,1);
      bVar28 = (bool)((byte)uVar31 & 1);
      auVar46._0_4_ = (uint)bVar28 * iVar42 | (uint)!bVar28 * (int)fVar6;
      bVar28 = (bool)((byte)(uVar31 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar28 * iVar43 | (uint)!bVar28 * (int)fVar7;
      bVar28 = (bool)((byte)(uVar31 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar28 * iVar59 | (uint)!bVar28 * (int)fVar8;
      bVar28 = (bool)((byte)(uVar31 >> 3) & 1);
      auVar46._12_4_ = (uint)bVar28 * iVar60 | (uint)!bVar28 * (int)fVar9;
      auVar47 = vrcp14ps_avx512vl(auVar48);
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar96 = ZEXT1664(auVar45);
      auVar44 = ZEXT816(0);
      auVar50 = vfnmadd213ps_avx512vl(auVar48,auVar47,auVar45);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar50,auVar47,auVar47)
      ;
      auVar47 = vrcp14ps_avx512vl(auVar49);
      auVar50 = vfnmadd213ps_avx512vl(auVar49,auVar47,auVar45);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar50,auVar47,auVar47)
      ;
      auVar47 = vrcp14ps_avx512vl(auVar46);
      auVar46 = vfnmadd213ps_avx512vl(auVar46,auVar47,auVar45);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar46,auVar47,auVar47)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      uVar31 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar44,1);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar31 >> 1) & 1) * auVar46._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar31 & 1) * auVar46._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar31 >> 2) & 1) * auVar46._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar31 >> 3) & 1) * auVar46._12_4_;
      uVar31 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar44,5);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar28 = (bool)((byte)uVar31 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar28 * auVar46._0_4_ | (uint)!bVar28 * 0x60;
      bVar28 = (bool)((byte)(uVar31 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar28 * auVar46._4_4_ | (uint)!bVar28 * 0x60;
      bVar28 = (bool)((byte)(uVar31 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar28 * auVar46._8_4_ | (uint)!bVar28 * 0x60;
      bVar28 = (bool)((byte)(uVar31 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar28 * auVar46._12_4_ | (uint)!bVar28 * 0x60;
      uVar31 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar44,5);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar28 = (bool)((byte)uVar31 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar28 * auVar46._0_4_ | (uint)!bVar28 * 0xa0;
      bVar28 = (bool)((byte)(uVar31 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar28 * auVar46._4_4_ | (uint)!bVar28 * 0xa0;
      bVar28 = (bool)((byte)(uVar31 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar28 * auVar46._8_4_ | (uint)!bVar28 * 0xa0;
      bVar28 = (bool)((byte)(uVar31 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar28 * auVar46._12_4_ | (uint)!bVar28 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar97 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar46 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar44);
      tray.tnear.field_0.i[0] =
           (uint)(bVar39 & 1) * auVar46._0_4_ |
           (uint)!(bool)(bVar39 & 1) * stack_near[0].field_0._0_4_;
      bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
      tray.tnear.field_0.i[1] =
           (uint)bVar28 * auVar46._4_4_ | (uint)!bVar28 * stack_near[0].field_0._4_4_;
      bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
      tray.tnear.field_0.i[2] =
           (uint)bVar28 * auVar46._8_4_ | (uint)!bVar28 * stack_near[0].field_0._8_4_;
      bVar28 = SUB81(uVar40 >> 3,0);
      tray.tnear.field_0.i[3] =
           (uint)bVar28 * auVar46._12_4_ | (uint)!bVar28 * stack_near[0].field_0._12_4_;
      auVar51 = vmaxps_avx512vl(auVar51,auVar44);
      tray.tfar.field_0.i[0] =
           (uint)(bVar39 & 1) * auVar51._0_4_ | (uint)!(bool)(bVar39 & 1) * -0x800000;
      bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * -0x800000;
      bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * -0x800000;
      bVar28 = SUB81(uVar40 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar37 = 3;
      }
      else {
        uVar37 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      bVar36 = (byte)((ushort)((short)uVar40 << 0xc) >> 0xc) ^ 0xf;
      pNVar38 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar33 = &stack_near[2].field_0;
      stack_near[1].field_0.i[0] = tray.tnear.field_0.v[0];
      stack_near[1].field_0.i[1] = tray.tnear.field_0.v[1];
      stack_near[1].field_0.i[2] = tray.tnear.field_0.v[2];
      stack_near[1].field_0.i[3] = tray.tnear.field_0.v[3];
      stack_node[1].ptr = sVar35;
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar98 = ZEXT1664(auVar51);
LAB_00770b7b:
      do {
        do {
          root.ptr = pNVar38[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0077113c;
          pNVar38 = pNVar38 + -1;
          vVar1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar33[-1].v;
          auVar63 = ZEXT1664((undefined1  [16])vVar1.field_0);
          paVar33 = paVar33 + -1;
          uVar40 = vcmpps_avx512vl((undefined1  [16])vVar1.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar40 == '\0');
        uVar30 = (undefined4)uVar40;
        if (uVar37 < (uint)POPCOUNT(uVar30)) {
LAB_00770bb7:
          do {
            iVar42 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0077113c;
              uVar13 = vcmpps_avx512vl(auVar63._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar13 != '\0') {
                if ((bVar36 & 0xf) == 0xf) {
                  bVar27 = 0;
                }
                else {
                  uVar40 = (ulong)(bVar36 & 0xf ^ 0xf);
                  bVar29 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                  pvVar2 = This->leafIntersector;
                  bVar27 = 0;
                  do {
                    lVar32 = 0;
                    for (uVar31 = uVar40; (uVar31 & 1) == 0;
                        uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                      lVar32 = lVar32 + 1;
                    }
                    cVar26 = (**(code **)((long)pvVar2 + (ulong)bVar29 * 0x40 + 0x18))
                                       (&pre,ray,lVar32,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    bVar19 = (byte)(1 << ((uint)lVar32 & 0x1f));
                    if (cVar26 == '\0') {
                      bVar19 = 0;
                    }
                    bVar27 = bVar27 | bVar19;
                    uVar40 = uVar40 - 1 & uVar40;
                  } while (uVar40 != 0);
                }
                bVar36 = bVar36 | bVar27;
                if (bVar36 == 0xf) {
                  bVar36 = 0xf;
                  goto LAB_0077113c;
                }
                auVar51 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar28 = (bool)(bVar36 >> 1 & 1);
                bVar3 = (bool)(bVar36 >> 2 & 1);
                bVar4 = (bool)(bVar36 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar36 & 1) * auVar51._0_4_ |
                     (uint)!(bool)(bVar36 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar3 * auVar51._8_4_ | (uint)!bVar3 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar4 * auVar51._12_4_ | (uint)!bVar4 * tray.tfar.field_0.i[3];
                auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar94 = ZEXT1664(auVar51);
                auVar51 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar95 = ZEXT1664(auVar51);
                auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar96 = ZEXT1664(auVar51);
                auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar97 = ZEXT1664(auVar51);
                auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar98 = ZEXT1664(auVar51);
              }
              goto LAB_00770b7b;
            }
            uVar40 = root.ptr & 0xfffffffffffffff0;
            lVar32 = 0x38;
            sVar35 = 8;
            auVar51 = auVar97._0_16_;
            do {
              sVar34 = *(size_t *)((uVar40 - 0x1c0) + lVar32 * 8);
              if (sVar34 == 8) {
                auVar63 = ZEXT1664(auVar51);
                sVar34 = sVar35;
                break;
              }
              if ((root.ptr & 7) == 0) {
                uVar30 = *(undefined4 *)((root.ptr - 0xa0) + lVar32 * 4);
                auVar67._4_4_ = uVar30;
                auVar67._0_4_ = uVar30;
                auVar67._8_4_ = uVar30;
                auVar67._12_4_ = uVar30;
                auVar45 = vfmsub132ps_fma(auVar67,(undefined1  [16])
                                                  tray.org_rdir.field_0.field_0.x.field_0,
                                          (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
                uVar30 = *(undefined4 *)((root.ptr - 0x60) + lVar32 * 4);
                auVar72._4_4_ = uVar30;
                auVar72._0_4_ = uVar30;
                auVar72._8_4_ = uVar30;
                auVar72._12_4_ = uVar30;
                auVar50 = vfmsub132ps_fma(auVar72,(undefined1  [16])
                                                  tray.org_rdir.field_0.field_0.y.field_0,
                                          (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
                uVar30 = *(undefined4 *)((root.ptr - 0x20) + lVar32 * 4);
                auVar80._4_4_ = uVar30;
                auVar80._0_4_ = uVar30;
                auVar80._8_4_ = uVar30;
                auVar80._12_4_ = uVar30;
                uVar30 = *(undefined4 *)((root.ptr - 0x80) + lVar32 * 4);
                auVar14._4_4_ = uVar30;
                auVar14._0_4_ = uVar30;
                auVar14._8_4_ = uVar30;
                auVar14._12_4_ = uVar30;
                auVar52 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                     (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0,
                                     auVar14);
                uVar30 = *(undefined4 *)((root.ptr - 0x40) + lVar32 * 4);
                auVar15._4_4_ = uVar30;
                auVar15._0_4_ = uVar30;
                auVar15._8_4_ = uVar30;
                auVar15._12_4_ = uVar30;
                auVar53 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                     (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,
                                     auVar15);
                auVar44 = vfmsub132ps_fma(auVar80,(undefined1  [16])
                                                  tray.org_rdir.field_0.field_0.z.field_0,
                                          (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
                uVar30 = *(undefined4 *)(root.ptr + lVar32 * 4);
                auVar16._4_4_ = uVar30;
                auVar16._0_4_ = uVar30;
                auVar16._8_4_ = uVar30;
                auVar16._12_4_ = uVar30;
                auVar54 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,
                                     (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0,
                                     auVar16);
                auVar46 = vpminsd_avx(auVar45,auVar52);
                auVar47 = vpminsd_avx(auVar50,auVar53);
                auVar46 = vpmaxsd_avx(auVar46,auVar47);
                auVar47 = vpminsd_avx(auVar44,auVar54);
                auVar46 = vpmaxsd_avx(auVar46,auVar47);
                auVar47 = vpmaxsd_avx(auVar45,auVar52);
                auVar45 = vpmaxsd_avx(auVar50,auVar53);
                auVar45 = vpminsd_avx(auVar47,auVar45);
                auVar47 = vpmaxsd_avx(auVar44,auVar54);
                auVar45 = vpminsd_avx(auVar45,auVar47);
                auVar24._4_4_ = tray.tnear.field_0.i[1];
                auVar24._0_4_ = tray.tnear.field_0.i[0];
                auVar24._8_4_ = tray.tnear.field_0.i[2];
                auVar24._12_4_ = tray.tnear.field_0.i[3];
                auVar47 = vpmaxsd_avx(auVar46,auVar24);
                auVar45 = vpminsd_avx(auVar45,(undefined1  [16])tray.tfar.field_0);
                uVar31 = vpcmpd_avx512vl(auVar47,auVar45,2);
                uVar31 = uVar31 & 0xf;
              }
              else {
                uVar30 = *(undefined4 *)((uVar40 - 0xa0) + lVar32 * 4);
                auVar65._4_4_ = uVar30;
                auVar65._0_4_ = uVar30;
                auVar65._8_4_ = uVar30;
                auVar65._12_4_ = uVar30;
                uVar30 = *(undefined4 *)((uVar40 - 0x80) + lVar32 * 4);
                auVar64._4_4_ = uVar30;
                auVar64._0_4_ = uVar30;
                auVar64._8_4_ = uVar30;
                auVar64._12_4_ = uVar30;
                uVar30 = *(undefined4 *)((uVar40 - 0x60) + lVar32 * 4);
                auVar62._4_4_ = uVar30;
                auVar62._0_4_ = uVar30;
                auVar62._8_4_ = uVar30;
                auVar62._12_4_ = uVar30;
                uVar30 = *(undefined4 *)((uVar40 - 0x40) + lVar32 * 4);
                auVar92._4_4_ = uVar30;
                auVar92._0_4_ = uVar30;
                auVar92._8_4_ = uVar30;
                auVar92._12_4_ = uVar30;
                uVar30 = *(undefined4 *)((uVar40 - 0x20) + lVar32 * 4);
                auVar88._4_4_ = uVar30;
                auVar88._0_4_ = uVar30;
                auVar88._8_4_ = uVar30;
                auVar88._12_4_ = uVar30;
                uVar30 = *(undefined4 *)(uVar40 + lVar32 * 4);
                auVar78._4_4_ = uVar30;
                auVar78._0_4_ = uVar30;
                auVar78._8_4_ = uVar30;
                auVar78._12_4_ = uVar30;
                fVar6 = *(float *)(uVar40 + 0x20 + lVar32 * 4);
                auVar73._4_4_ = fVar6;
                auVar73._0_4_ = fVar6;
                auVar73._8_4_ = fVar6;
                auVar73._12_4_ = fVar6;
                fVar7 = *(float *)(uVar40 + 0x40 + lVar32 * 4);
                auVar69._4_4_ = fVar7;
                auVar69._0_4_ = fVar7;
                auVar69._8_4_ = fVar7;
                auVar69._12_4_ = fVar7;
                fVar8 = *(float *)(uVar40 + 0x60 + lVar32 * 4);
                auVar66._4_4_ = fVar8;
                auVar66._0_4_ = fVar8;
                auVar66._8_4_ = fVar8;
                auVar66._12_4_ = fVar8;
                auVar21._4_4_ = tray.org.field_0._4_4_;
                auVar21._0_4_ = tray.org.field_0._0_4_;
                auVar21._8_4_ = tray.org.field_0._8_4_;
                auVar21._12_4_ = tray.org.field_0._12_4_;
                auVar22._4_4_ = tray.org.field_0._20_4_;
                auVar22._0_4_ = tray.org.field_0._16_4_;
                auVar22._8_4_ = tray.org.field_0._24_4_;
                auVar22._12_4_ = tray.org.field_0._28_4_;
                auVar23._4_4_ = tray.org.field_0._36_4_;
                auVar23._0_4_ = tray.org.field_0._32_4_;
                auVar23._8_4_ = tray.org.field_0._40_4_;
                auVar23._12_4_ = tray.org.field_0._44_4_;
                auVar81._0_4_ = (float)tray.dir.field_0._32_4_ * fVar6;
                auVar81._4_4_ = (float)tray.dir.field_0._36_4_ * fVar6;
                auVar81._8_4_ = (float)tray.dir.field_0._40_4_ * fVar6;
                auVar81._12_4_ = (float)tray.dir.field_0._44_4_ * fVar6;
                auVar82._0_4_ = (float)tray.dir.field_0._32_4_ * fVar7;
                auVar82._4_4_ = (float)tray.dir.field_0._36_4_ * fVar7;
                auVar82._8_4_ = (float)tray.dir.field_0._40_4_ * fVar7;
                auVar82._12_4_ = (float)tray.dir.field_0._44_4_ * fVar7;
                auVar85._0_4_ = (float)tray.dir.field_0._32_4_ * fVar8;
                auVar85._4_4_ = (float)tray.dir.field_0._36_4_ * fVar8;
                auVar85._8_4_ = (float)tray.dir.field_0._40_4_ * fVar8;
                auVar85._12_4_ = (float)tray.dir.field_0._44_4_ * fVar8;
                auVar46 = vfmadd231ps_avx512vl
                                    (auVar81,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar92);
                auVar47 = vfmadd231ps_avx512vl
                                    (auVar82,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar88);
                auVar45 = vfmadd231ps_avx512vl
                                    (auVar85,auVar78,
                                     (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar46 = vfmadd231ps_avx512vl
                                    (auVar46,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar65);
                auVar47 = vfmadd231ps_avx512vl
                                    (auVar47,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                     auVar64);
                auVar45 = vfmadd231ps_avx512vl
                                    (auVar45,auVar62,
                                     (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar44 = auVar94._0_16_;
                auVar50 = vandps_avx512vl(auVar46,auVar44);
                auVar52 = auVar95._0_16_;
                uVar31 = vcmpps_avx512vl(auVar50,auVar52,1);
                bVar28 = (bool)((byte)uVar31 & 1);
                iVar43 = auVar95._0_4_;
                auVar55._0_4_ = (uint)bVar28 * iVar43 | (uint)!bVar28 * auVar46._0_4_;
                bVar28 = (bool)((byte)(uVar31 >> 1) & 1);
                iVar59 = auVar95._4_4_;
                auVar55._4_4_ = (uint)bVar28 * iVar59 | (uint)!bVar28 * auVar46._4_4_;
                bVar28 = (bool)((byte)(uVar31 >> 2) & 1);
                iVar60 = auVar95._8_4_;
                iVar61 = auVar95._12_4_;
                auVar55._8_4_ = (uint)bVar28 * iVar60 | (uint)!bVar28 * auVar46._8_4_;
                bVar28 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar55._12_4_ = (uint)bVar28 * iVar61 | (uint)!bVar28 * auVar46._12_4_;
                auVar46 = vandps_avx512vl(auVar47,auVar44);
                uVar31 = vcmpps_avx512vl(auVar46,auVar52,1);
                bVar28 = (bool)((byte)uVar31 & 1);
                auVar56._0_4_ = (uint)bVar28 * iVar43 | (uint)!bVar28 * auVar47._0_4_;
                bVar28 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar28 * iVar59 | (uint)!bVar28 * auVar47._4_4_;
                bVar28 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar28 * iVar60 | (uint)!bVar28 * auVar47._8_4_;
                bVar28 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar56._12_4_ = (uint)bVar28 * iVar61 | (uint)!bVar28 * auVar47._12_4_;
                auVar46 = vandps_avx512vl(auVar45,auVar44);
                uVar31 = vcmpps_avx512vl(auVar46,auVar52,1);
                bVar28 = (bool)((byte)uVar31 & 1);
                auVar57._0_4_ = (uint)bVar28 * iVar43 | (uint)!bVar28 * auVar45._0_4_;
                bVar28 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar57._4_4_ = (uint)bVar28 * iVar59 | (uint)!bVar28 * auVar45._4_4_;
                bVar28 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar57._8_4_ = (uint)bVar28 * iVar60 | (uint)!bVar28 * auVar45._8_4_;
                bVar28 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar57._12_4_ = (uint)bVar28 * iVar61 | (uint)!bVar28 * auVar45._12_4_;
                auVar46 = vrcp14ps_avx512vl(auVar55);
                auVar45 = auVar96._0_16_;
                auVar47 = vfnmadd213ps_avx512vl(auVar55,auVar46,auVar45);
                auVar50 = vfmadd132ps_avx512vl(auVar47,auVar46,auVar46);
                auVar46 = vrcp14ps_avx512vl(auVar56);
                auVar47 = vfnmadd213ps_avx512vl(auVar56,auVar46,auVar45);
                auVar44 = vfmadd132ps_avx512vl(auVar47,auVar46,auVar46);
                auVar46 = vrcp14ps_avx512vl(auVar57);
                auVar47 = vfnmadd213ps_avx512vl(auVar57,auVar46,auVar45);
                auVar52 = vfmadd132ps_avx512vl(auVar47,auVar46,auVar46);
                auVar45 = auVar98._0_16_;
                auVar53 = vxorps_avx512vl(auVar50,auVar45);
                auVar54 = vxorps_avx512vl(auVar44,auVar45);
                uVar30 = *(undefined4 *)(uVar40 + 0x80 + lVar32 * 4);
                auVar47._4_4_ = uVar30;
                auVar47._0_4_ = uVar30;
                auVar47._8_4_ = uVar30;
                auVar47._12_4_ = uVar30;
                auVar46 = vfmadd213ps_avx512vl(auVar73,auVar23,auVar47);
                uVar30 = *(undefined4 *)(uVar40 + 0xa0 + lVar32 * 4);
                auVar17._4_4_ = uVar30;
                auVar17._0_4_ = uVar30;
                auVar17._8_4_ = uVar30;
                auVar17._12_4_ = uVar30;
                auVar47 = vfmadd213ps_avx512vl(auVar69,auVar23,auVar17);
                auVar58 = vxorps_avx512vl(auVar52,auVar45);
                uVar30 = *(undefined4 *)(uVar40 + 0xc0 + lVar32 * 4);
                auVar18._4_4_ = uVar30;
                auVar18._0_4_ = uVar30;
                auVar18._8_4_ = uVar30;
                auVar18._12_4_ = uVar30;
                auVar45 = vfmadd213ps_avx512vl(auVar66,auVar23,auVar18);
                auVar46 = vfmadd231ps_fma(auVar46,auVar22,auVar92);
                auVar47 = vfmadd231ps_fma(auVar47,auVar22,auVar88);
                auVar45 = vfmadd231ps_fma(auVar45,auVar22,auVar78);
                auVar46 = vfmadd231ps_fma(auVar46,auVar21,auVar65);
                auVar53 = vmulps_avx512vl(auVar46,auVar53);
                auVar46 = vfmadd231ps_fma(auVar47,auVar21,auVar64);
                auVar54 = vmulps_avx512vl(auVar46,auVar54);
                auVar46 = vfmadd231ps_fma(auVar45,auVar21,auVar62);
                auVar58 = vmulps_avx512vl(auVar46,auVar58);
                auVar68._0_4_ = auVar50._0_4_ + auVar53._0_4_;
                auVar68._4_4_ = auVar50._4_4_ + auVar53._4_4_;
                auVar68._8_4_ = auVar50._8_4_ + auVar53._8_4_;
                auVar68._12_4_ = auVar50._12_4_ + auVar53._12_4_;
                auVar70._0_4_ = auVar44._0_4_ + auVar54._0_4_;
                auVar70._4_4_ = auVar44._4_4_ + auVar54._4_4_;
                auVar70._8_4_ = auVar44._8_4_ + auVar54._8_4_;
                auVar70._12_4_ = auVar44._12_4_ + auVar54._12_4_;
                auVar74._0_4_ = auVar52._0_4_ + auVar58._0_4_;
                auVar74._4_4_ = auVar52._4_4_ + auVar58._4_4_;
                auVar74._8_4_ = auVar52._8_4_ + auVar58._8_4_;
                auVar74._12_4_ = auVar52._12_4_ + auVar58._12_4_;
                auVar46 = vpminsd_avx(auVar53,auVar68);
                auVar47 = vpminsd_avx(auVar54,auVar70);
                auVar46 = vpmaxsd_avx(auVar46,auVar47);
                auVar47 = vpminsd_avx(auVar58,auVar74);
                auVar46 = vpmaxsd_avx(auVar46,auVar47);
                auVar47 = vpmaxsd_avx(auVar53,auVar68);
                auVar45 = vpmaxsd_avx(auVar54,auVar70);
                auVar45 = vpminsd_avx(auVar47,auVar45);
                auVar47 = vpmaxsd_avx(auVar58,auVar74);
                auVar45 = vpminsd_avx(auVar45,auVar47);
                auVar25._4_4_ = tray.tnear.field_0.i[1];
                auVar25._0_4_ = tray.tnear.field_0.i[0];
                auVar25._8_4_ = tray.tnear.field_0.i[2];
                auVar25._12_4_ = tray.tnear.field_0.i[3];
                auVar47 = vpmaxsd_avx(auVar46,auVar25);
                auVar45 = vpminsd_avx(auVar45,(undefined1  [16])tray.tfar.field_0);
                uVar31 = vcmpps_avx512vl(auVar47,auVar45,2);
              }
              if ((uVar31 & 0xf) == 0) {
                auVar63 = ZEXT1664(auVar51);
                sVar34 = sVar35;
              }
              else {
                auVar47 = vblendmps_avx512vl(auVar97._0_16_,auVar46);
                bVar28 = (bool)((byte)uVar31 & 1);
                bVar3 = (bool)((byte)(uVar31 >> 1) & 1);
                bVar4 = (bool)((byte)(uVar31 >> 2) & 1);
                bVar5 = (bool)((byte)(uVar31 >> 3) & 1);
                auVar63 = ZEXT1664(CONCAT412((uint)bVar5 * auVar47._12_4_ |
                                             (uint)!bVar5 * auVar46._12_4_,
                                             CONCAT48((uint)bVar4 * auVar47._8_4_ |
                                                      (uint)!bVar4 * auVar46._8_4_,
                                                      CONCAT44((uint)bVar3 * auVar47._4_4_ |
                                                               (uint)!bVar3 * auVar46._4_4_,
                                                               (uint)bVar28 * auVar47._0_4_ |
                                                               (uint)!bVar28 * auVar46._0_4_))));
                if (sVar35 != 8) {
                  pNVar38->ptr = sVar35;
                  pNVar38 = pNVar38 + 1;
                  *(undefined1 (*) [16])paVar33->v = auVar51;
                  paVar33 = paVar33 + 1;
                }
              }
              lVar32 = lVar32 + 1;
              auVar51 = auVar63._0_16_;
              sVar35 = sVar34;
            } while (lVar32 != 0x40);
            if (sVar34 == 8) goto LAB_00770f07;
            uVar13 = vcmpps_avx512vl((undefined1  [16])auVar63._0_16_,
                                     (undefined1  [16])tray.tfar.field_0,9);
            root.ptr = sVar34;
          } while ((byte)uVar37 < (byte)POPCOUNT((int)uVar13));
          pNVar38->ptr = sVar34;
          pNVar38 = pNVar38 + 1;
          *paVar33 = auVar63._0_16_;
          paVar33 = paVar33 + 1;
        }
        else {
          do {
            sVar35 = 0;
            for (uVar31 = uVar40; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              sVar35 = sVar35 + 1;
            }
            bVar28 = occluded1(This,bvh,root,sVar35,&pre,ray,&tray,context);
            bVar29 = (byte)(1 << ((uint)sVar35 & 0x1f));
            if (!bVar28) {
              bVar29 = 0;
            }
            bVar36 = bVar36 | bVar29;
            uVar40 = uVar40 - 1 & uVar40;
          } while (uVar40 != 0);
          iVar42 = 3;
          if (bVar36 != 0xf) {
            auVar51 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar28 = (bool)(bVar36 >> 1 & 1);
            bVar3 = (bool)(bVar36 >> 2 & 1);
            bVar4 = (bool)(bVar36 >> 3 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * tray.tfar.field_0.i[1];
            tray.tfar.field_0.i[0] =
                 (uint)(bVar36 & 1) * auVar51._0_4_ |
                 (uint)!(bool)(bVar36 & 1) * tray.tfar.field_0.i[0];
            tray.tfar.field_0.i[2] =
                 (uint)bVar3 * auVar51._8_4_ | (uint)!bVar3 * tray.tfar.field_0.i[2];
            tray.tfar.field_0.i[3] =
                 (uint)bVar4 * auVar51._12_4_ | (uint)!bVar4 * tray.tfar.field_0.i[3];
            iVar42 = 2;
          }
          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar94 = ZEXT1664(auVar51);
          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar95 = ZEXT1664(auVar51);
          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar96 = ZEXT1664(auVar51);
          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar97 = ZEXT1664(auVar51);
          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar98 = ZEXT1664(auVar51);
          auVar63 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if (uVar37 < (uint)POPCOUNT(uVar30)) goto LAB_00770bb7;
        }
LAB_00770f07:
      } while (iVar42 != 3);
LAB_0077113c:
      bVar36 = bVar36 & bVar39;
      bVar28 = (bool)(bVar36 >> 1 & 1);
      bVar3 = (bool)(bVar36 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar36 & 1) * -0x800000 | (uint)!(bool)(bVar36 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar28 * -0x800000 | (uint)!bVar28 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar3 * -0x800000 | (uint)!bVar3 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar36 >> 3) * -0x800000 | (uint)!(bool)(bVar36 >> 3) * *(int *)(ray + 0x8c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }